

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O1

Function * __thiscall soul::Module::Functions::at(Functions *this,size_t index)

{
  if (index < (this->functions).numActive) {
    return (this->functions).items[index].object;
  }
  throwInternalCompilerError("index < numActive","operator[]",0x9f);
}

Assistant:

const Item& operator[] (size_t index) const             { SOUL_ASSERT (index < numActive); return items[index]; }